

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O3

PVIPNode * PVIP_node_append_string(PVIPParserContext *parser,PVIPNode *node,char *txt,size_t length)

{
  _PVIPNode *p_Var1;
  PVIP_category_t PVar2;
  PVIPNode *pPVar3;
  PVIPString *str;
  
  if (node->type == PVIP_NODE_STRING_CONCAT) {
    p_Var1 = (node->field_2).children.nodes[(long)(node->field_2).children.size + -1];
    if (p_Var1->type != PVIP_NODE_STRING) {
      pPVar3 = PVIP_node_new_string(parser,PVIP_NODE_STRING,txt,length);
      pPVar3 = PVIP_node_new_children2(parser,PVIP_NODE_STRING_CONCAT,node,pPVar3);
      return pPVar3;
    }
    str = (p_Var1->field_2).pv;
  }
  else {
    PVar2 = PVIP_node_category(node->type);
    if (PVar2 != PVIP_CATEGORY_STRING) {
      __assert_fail("PVIP_node_category(node->type) == PVIP_CATEGORY_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                    ,0x83,
                    "PVIPNode *PVIP_node_append_string(PVIPParserContext *, PVIPNode *, const char *, size_t)"
                   );
    }
    str = (node->field_2).pv;
  }
  PVIP_string_concat(str,txt,length);
  return node;
}

Assistant:

PVIPNode* PVIP_node_append_string(PVIPParserContext *parser, PVIPNode *node, const char* txt, size_t length) {
    if (node->type == PVIP_NODE_STRING_CONCAT) {
        if (node->children.nodes[node->children.size-1]->type == PVIP_NODE_STRING) {
            PVIP_string_concat(node->children.nodes[node->children.size-1]->pv, txt, length);
            return node;
        } else {
            PVIPNode *s = PVIP_node_new_string(parser, PVIP_NODE_STRING, txt, length);
            return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, s);
        }
    }

    assert(PVIP_node_category(node->type) == PVIP_CATEGORY_STRING);
    PVIP_string_concat(node->pv, txt, length);
    return node;
}